

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int iVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  int iVar4;
  
  pCVar2 = L->ci;
  L->ci = pCVar2 + -1;
  pTVar3 = pCVar2->func;
  iVar1 = pCVar2->nresults;
  L->base = pCVar2[-1].base;
  L->savedpc = pCVar2[-1].savedpc;
  iVar4 = iVar1;
  for (; (iVar4 != 0 && (firstResult < L->top)); firstResult = firstResult + 1) {
    pTVar3->value = firstResult->value;
    pTVar3->tt = firstResult->tt;
    pTVar3 = pTVar3 + 1;
    iVar4 = iVar4 + -1;
  }
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    pTVar3->tt = 0;
    pTVar3 = pTVar3 + 1;
  }
  L->top = pTVar3;
  return iVar1 + 1;
}

Assistant:

static int luaD_poscall(lua_State*L,StkId firstResult){
StkId res;
int wanted,i;
CallInfo*ci;
ci=L->ci--;
res=ci->func;
wanted=ci->nresults;
L->base=(ci-1)->base;
L->savedpc=(ci-1)->savedpc;
for(i=wanted;i!=0&&firstResult<L->top;i--)
setobj(L,res++,firstResult++);
while(i-->0)
setnilvalue(res++);
L->top=res;
return(wanted-(-1));
}